

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-from-pseudo-trace-type.cpp
# Opt level: O0

Up __thiscall
yactfr::internal::TraceTypeFromPseudoTraceTypeConverter::_traceTypeFromPseudoTraceType
          (TraceTypeFromPseudoTraceTypeConverter *this)

{
  bool bVar1;
  PseudoDsts *this_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *args_3
  ;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *args_4
  ;
  TraceEnvironment *args_5;
  TraceEnvironment *args_6;
  PseudoDt *pPVar2;
  ClockTypeSet *args_8;
  PseudoDst *in_RSI;
  pair<std::_Rb_tree_const_iterator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>,_bool>
  pVar3;
  undefined1 local_a8 [8];
  set<std::unique_ptr<const_yactfr::ClockType,_std::default_delete<const_yactfr::ClockType>_>,_yactfr::internal::ClkTypeAddrComp,_std::allocator<std::unique_ptr<const_yactfr::ClockType,_std::default_delete<const_yactfr::ClockType>_>_>_>
  local_a0;
  TraceTypeFromPseudoTraceTypeConverter local_70;
  pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>
  *idPseudoDstPair;
  iterator __end2;
  iterator __begin2;
  PseudoDsts *__range2;
  DataStreamTypeSet dstSet;
  TraceTypeFromPseudoTraceTypeConverter *this_local;
  
  PseudoTraceType::validate((PseudoTraceType *)in_RSI->_id);
  std::
  set<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_yactfr::internal::DstIdComp,_std::allocator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>_>
  ::set((set<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_yactfr::internal::DstIdComp,_std::allocator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>_>
         *)&__range2);
  this_00 = PseudoTraceType::pseudoDsts((PseudoTraceType *)in_RSI->_id);
  __end2 = std::
           unordered_map<unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>_>_>
           ::begin(this_00);
  idPseudoDstPair =
       (pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>
        *)std::
          unordered_map<unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>_>_>
          ::end(this_00);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>,_false>
                         *)&idPseudoDstPair);
    if (!bVar1) break;
    local_70._pseudoTraceType =
         (PseudoTraceType *)
         std::__detail::
         _Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>,_false,_false>
         ::operator*(&__end2);
    std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
    ::operator*((unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>
                 *)&(local_70._pseudoTraceType)->_majorVersion);
    _dstFromPseudoDst(&local_70,in_RSI);
    pVar3 = std::
            set<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_yactfr::internal::DstIdComp,_std::allocator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>_>
            ::insert((set<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_yactfr::internal::DstIdComp,_std::allocator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>_>
                      *)&__range2,(value_type *)&local_70);
    local_a0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pVar3.first._M_node
    ;
    local_a0._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ = pVar3.second;
    std::
    unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>::
    ~unique_ptr((unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
                 *)&local_70);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::PseudoDst,_std::default_delete<yactfr::internal::PseudoDst>_>_>,_false,_false>
    ::operator++(&__end2);
  }
  local_a0._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       PseudoTraceType::majorVersion((PseudoTraceType *)in_RSI->_id);
  local_a0._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       PseudoTraceType::minorVersion((PseudoTraceType *)in_RSI->_id);
  args_3 = PseudoTraceType::ns_abi_cxx11_((PseudoTraceType *)in_RSI->_id);
  args_4 = PseudoTraceType::name_abi_cxx11_((PseudoTraceType *)in_RSI->_id);
  args_5 = (TraceEnvironment *)PseudoTraceType::uid_abi_cxx11_((PseudoTraceType *)in_RSI->_id);
  args_6 = PseudoTraceType::env((PseudoTraceType *)in_RSI->_id);
  pPVar2 = PseudoTraceType::pseudoPktHeaderType((PseudoTraceType *)in_RSI->_id);
  _scopeStructTypeFromPseudoDt
            ((TraceTypeFromPseudoTraceTypeConverter *)(local_a8 + 8),(PseudoDt *)in_RSI,
             (Scope)pPVar2,(PseudoDst *)0x0,(PseudoErt *)0x0);
  args_8 = PseudoTraceType::clkTypes((PseudoTraceType *)in_RSI->_id);
  WithAttrsMixin::attrs((WithAttrsMixin *)in_RSI->_id);
  tryCloneAttrs((MapItem *)local_a8);
  TraceType::
  create<unsigned_int,unsigned_int,boost::optional<std::__cxx11::string>const&,boost::optional<std::__cxx11::string>const&,boost::optional<std::__cxx11::string>const&,yactfr::TraceEnvironment_const&,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,std::set<std::unique_ptr<yactfr::ClockType_const,std::default_delete<yactfr::ClockType_const>>,yactfr::internal::ClkTypeAddrComp,std::allocator<std::unique_ptr<yactfr::ClockType_const,std::default_delete<yactfr::ClockType_const>>>>,std::set<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>,yactfr::internal::DstIdComp,std::allocator<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>>>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((uint *)this,(uint *)((long)&local_a0._M_t._M_impl + 0xc),
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&local_a0._M_t._M_impl + 8),args_3,args_4,args_5,
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)args_6,
             (set<std::unique_ptr<const_yactfr::ClockType,_std::default_delete<const_yactfr::ClockType>_>,_yactfr::internal::ClkTypeAddrComp,_std::allocator<std::unique_ptr<const_yactfr::ClockType,_std::default_delete<const_yactfr::ClockType>_>_>_>
              *)(local_a8 + 8),
             (set<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_yactfr::internal::DstIdComp,_std::allocator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>_>
              *)args_8,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &__range2);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_a8);
  std::unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>::
  ~unique_ptr((unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
               *)(local_a8 + 8));
  std::
  set<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_yactfr::internal::DstIdComp,_std::allocator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>_>
  ::~set((set<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_yactfr::internal::DstIdComp,_std::allocator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>_>
          *)&__range2);
  return (__uniq_ptr_data<const_yactfr::TraceType,_std::default_delete<const_yactfr::TraceType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::TraceType,_std::default_delete<const_yactfr::TraceType>,_true,_true>
            )this;
}

Assistant:

TraceType::Up TraceTypeFromPseudoTraceTypeConverter::_traceTypeFromPseudoTraceType()
{
    // validate first
    _pseudoTraceType->validate();

    DataStreamTypeSet dstSet;

    for (auto& idPseudoDstPair : _pseudoTraceType->pseudoDsts()) {
        dstSet.insert(this->_dstFromPseudoDst(*idPseudoDstPair.second));
    }

    // create yactfr trace type
    return TraceType::create(_pseudoTraceType->majorVersion(), _pseudoTraceType->minorVersion(),
                             _pseudoTraceType->ns(), _pseudoTraceType->name(),
                             _pseudoTraceType->uid(), _pseudoTraceType->env(),
                             this->_scopeStructTypeFromPseudoDt(_pseudoTraceType->pseudoPktHeaderType(),
                                                                Scope::PacketHeader),
                             std::move(_pseudoTraceType->clkTypes()), std::move(dstSet),
                             tryCloneAttrs(_pseudoTraceType->attrs()));
}